

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

void Pdr_ManVerifyInvariant(Pdr_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Ptr_t *p_00;
  sat_solver *s;
  Pdr_Set_t *pPVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  abctime aVar9;
  abctime clk;
  int Counter;
  int RetValue;
  int kThis;
  int kStart;
  int i;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  Pdr_Man_t *p_local;
  
  clk._4_4_ = 0;
  aVar4 = Abc_Clock();
  iVar1 = Pdr_ManFindInvariantStart(p);
  p_00 = Pdr_ManCollectCubes(p,iVar1);
  iVar1 = Vec_PtrSize(p->vSolvers);
  s = Pdr_ManCreateSolver(p,iVar1);
  kThis = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(p_00);
    if (iVar2 <= kThis) {
      for (kThis = 0; iVar2 = Vec_PtrSize(p_00), kThis < iVar2; kThis = kThis + 1) {
        pPVar5 = (Pdr_Set_t *)Vec_PtrEntry(p_00,kThis);
        pVVar6 = Pdr_ManCubeToLits(p,iVar1,pPVar5,0,1);
        piVar7 = Vec_IntArray(pVVar6);
        piVar8 = Vec_IntArray(pVVar6);
        iVar2 = Vec_IntSize(pVVar6);
        iVar2 = sat_solver_solve(s,piVar7,piVar8 + iVar2,0,0,0,0);
        if (iVar2 != -1) {
          Abc_Print(1,"Verification of clause %d failed.\n",(ulong)(uint)kThis);
          clk._4_4_ = clk._4_4_ + 1;
        }
      }
      if (clk._4_4_ == 0) {
        uVar3 = Vec_PtrSize(p_00);
        Abc_Print(1,"Verification of invariant with %d clauses was successful.  ",(ulong)uVar3);
        aVar9 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar9 - aVar4);
      }
      else {
        Abc_Print(1,"Verification of %d clauses has failed.\n",(ulong)clk._4_4_);
      }
      Vec_PtrFree(p_00);
      return;
    }
    pPVar5 = (Pdr_Set_t *)Vec_PtrEntry(p_00,kThis);
    pVVar6 = Pdr_ManCubeToLits(p,iVar1,pPVar5,1,0);
    piVar7 = Vec_IntArray(pVVar6);
    piVar8 = Vec_IntArray(pVVar6);
    iVar2 = Vec_IntSize(pVVar6);
    iVar2 = sat_solver_addclause(s,piVar7,piVar8 + iVar2);
    if (iVar2 == 0) break;
    sat_solver_compress(s);
    kThis = kThis + 1;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrInv.c"
                ,0x1fd,"void Pdr_ManVerifyInvariant(Pdr_Man_t *)");
}

Assistant:

void Pdr_ManVerifyInvariant( Pdr_Man_t * p )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart, kThis, RetValue, Counter = 0;
    abctime clk = Abc_Clock();
    // collect cubes used in the inductive invariant
    kStart = Pdr_ManFindInvariantStart( p );
    vCubes = Pdr_ManCollectCubes( p, kStart );
    // create solver with the cubes
    kThis = Vec_PtrSize(p->vSolvers);
    pSat  = Pdr_ManCreateSolver( p, kThis );
    // add the property output
//    Pdr_ManSetPropertyOutput( p, kThis );
    // add the clauses
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 1, 0 );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
        assert( RetValue );
        sat_solver_compress( pSat );
    }
    // check each clause
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 0, 1 );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        if ( RetValue != l_False )
        {
            Abc_Print( 1, "Verification of clause %d failed.\n", i );
            Counter++;
        }
    }
    if ( Counter )
        Abc_Print( 1, "Verification of %d clauses has failed.\n", Counter );
    else
    {
        Abc_Print( 1, "Verification of invariant with %d clauses was successful.  ", Vec_PtrSize(vCubes) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
//    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
}